

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sync.h
# Opt level: O1

void __thiscall
UniqueLock<AnnotatedMixin<std::mutex>_>::reverse_lock::~reverse_lock(reverse_lock *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  long lVar3;
  UniqueLock<AnnotatedMixin<std::mutex>_> *pUVar4;
  mutex_type *pmVar5;
  pointer pcVar6;
  long in_FS_OFFSET;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pUVar4 = this->lock;
  pmVar5 = (this->templock).super_unique_lock._M_device;
  (this->templock).super_unique_lock._M_device = (pUVar4->super_unique_lock)._M_device;
  (pUVar4->super_unique_lock)._M_device = pmVar5;
  bVar2 = (this->templock).super_unique_lock._M_owns;
  (this->templock).super_unique_lock._M_owns = (pUVar4->super_unique_lock)._M_owns;
  (pUVar4->super_unique_lock)._M_owns = bVar2;
  std::unique_lock<std::mutex>::lock(&this->lock->super_unique_lock);
  pcVar6 = (this->file)._M_dataplus._M_p;
  paVar1 = &(this->file).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar6 != paVar1) {
    operator_delete(pcVar6,paVar1->_M_allocated_capacity + 1);
  }
  pcVar6 = (this->lockname)._M_dataplus._M_p;
  paVar1 = &(this->lockname).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar6 != paVar1) {
    operator_delete(pcVar6,paVar1->_M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    std::unique_lock<std::mutex>::~unique_lock(&(this->templock).super_unique_lock);
    return;
  }
  __stack_chk_fail();
}

Assistant:

~reverse_lock() {
            templock.swap(lock);
            EnterCritical(lockname.c_str(), file.c_str(), line, lock.mutex());
            lock.lock();
        }